

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O1

void __thiscall re2::SparseArray<int>::~SparseArray(SparseArray<int> *this)

{
  IndexValue *pIVar1;
  int *piVar2;
  
  DebugCheckInvariants(this);
  pIVar1 = (this->dense_).ptr_._M_t.
           super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
           .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl;
  if (pIVar1 != (IndexValue *)0x0) {
    operator_delete(pIVar1);
  }
  (this->dense_).ptr_._M_t.
  super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
  .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl =
       (IndexValue *)0x0;
  piVar2 = (this->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
           super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  if (piVar2 != (int *)0x0) {
    operator_delete(piVar2);
  }
  (this->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
  super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (int *)0x0;
  return;
}

Assistant:

SparseArray<Value>::~SparseArray() {
  DebugCheckInvariants();
}